

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cc
# Opt level: O0

void __thiscall t_client_wrapper::f_on_message(t_client_wrapper *this,wstring_view a_message)

{
  t_type *ptVar1;
  t_object *ptVar2;
  t_object *a_index;
  undefined1 local_48 [32];
  t_callback_library *local_28;
  t_callback_library *library;
  t_client_wrapper *this_local;
  wstring_view a_message_local;
  
  a_message_local._M_len = (size_t)a_message._M_str;
  this_local = (t_client_wrapper *)a_message._M_len;
  library = (t_callback_library *)this;
  ptVar1 = xemmai::t_object::f_type(this->v_self);
  ptVar2 = xemmai::t_slot::operator->(&ptVar1->v_module);
  local_28 = xemmai::t_object::f_as<t_callback_library>(ptVar2);
  ptVar2 = this->v_self;
  a_index = xemmai::t_slot::operator_cast_to_t_object_(&local_28->v_symbol_on_message);
  t_callback_library::f_as<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&>
            ((t_callback_library *)(local_48 + 0x10),
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_28);
  xemmai::t_object::f_invoke<xemmai::t_value<xemmai::t_pointer>>
            ((t_object *)local_48,ptVar2,(size_t *)a_index,
             (t_value<xemmai::t_pointer> *)&f_on_message::index);
  return;
}

Assistant:

virtual void f_on_message(std::wstring_view a_message)
	{
		auto& library = v_self->f_type()->v_module->f_as<t_callback_library>();
		static size_t index;
		v_self->f_invoke(library.v_symbol_on_message, index, library.f_as(a_message));
	}